

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *spec,TestIterationType type)

{
  ulong uVar1;
  char *description;
  char *description_00;
  char *description_01;
  int iVar2;
  bool bVar3;
  
  bVar3 = type == TYPE_DRAW_COUNT;
  description_01 = "instance count = 1";
  if (bVar3) {
    description_01 = "draw count = 1";
  }
  description = "instance count = 4";
  if (bVar3) {
    description = "draw count = 5";
  }
  iVar2 = 0xb;
  if (bVar3) {
    iVar2 = 0x19;
  }
  description_00 = "instance count = 11";
  if (bVar3) {
    description_00 = "draw count = 25";
  }
  uVar1 = (ulong)!bVar3;
  (&spec->primitiveCount)[uVar1 * 8] = 1;
  addRangeElementsToSpec(spec);
  deqp::gls::DrawTest::addIteration(test,spec,description_01);
  (&spec->primitiveCount)[uVar1 * 8] = bVar3 | 4;
  addRangeElementsToSpec(spec);
  deqp::gls::DrawTest::addIteration(test,spec,description);
  (&spec->primitiveCount)[uVar1 * 8] = iVar2;
  addRangeElementsToSpec(spec);
  deqp::gls::DrawTest::addIteration(test,spec,description_00);
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, gls::DrawTestSpec& spec, TestIterationType type)
{
	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else if (type == TYPE_INSTANCE_COUNT)
	{
		spec.instanceCount = 1;
		test->addIteration(spec, "instance count = 1");

		spec.instanceCount = 4;
		test->addIteration(spec, "instance count = 4");

		spec.instanceCount = 11;
		test->addIteration(spec, "instance count = 11");
	}
	else
		DE_ASSERT(false);
}